

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogleg.c
# Opt level: O3

void dogleg(int n,double *r,int lr,double *diag,double *qtb,double delta,double *x,double *wa1,
           double *wa2)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double local_98;
  double local_48;
  
  dVar17 = dpmpar(1);
  uVar14 = n + 1;
  if (0 < n) {
    iVar1 = (int)(uVar14 * n) / 2;
    iVar3 = iVar1 + 1;
    pdVar4 = x + (long)(int)uVar14 + -1;
    iVar11 = -2;
    uVar12 = 1;
    iVar13 = 0;
    uVar15 = uVar14;
    do {
      lVar7 = (uint)n - uVar12;
      dVar22 = 0.0;
      if (lVar7 <= (long)((ulong)(uint)n - 2)) {
        lVar6 = 0;
        do {
          dVar22 = dVar22 + r[iVar1 + lVar6] * pdVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar13 != (int)lVar6);
      }
      iVar3 = iVar3 - (int)uVar12;
      dVar23 = r[(long)iVar3 + -1];
      if ((dVar23 == 0.0) && (!NAN(dVar23))) {
        if (-1 < lVar7) {
          lVar6 = (ulong)uVar15 - 1;
          iVar5 = (int)lVar7 + 1;
          iVar9 = n + -1;
          do {
            uVar16 = -(ulong)(ABS(r[(long)iVar5 + -1]) <= dVar23);
            dVar23 = (double)(uVar16 & (ulong)dVar23 | ~uVar16 & (ulong)ABS(r[(long)iVar5 + -1]));
            iVar5 = iVar5 + iVar9;
            iVar9 = iVar9 + -1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
        dVar23 = dVar23 * dVar17;
        if ((dVar23 == 0.0) && (!NAN(dVar23))) {
          dVar23 = dVar17;
        }
      }
      x[lVar7] = (qtb[lVar7] - dVar22) / dVar23;
      uVar12 = uVar12 + 1;
      iVar1 = iVar1 + iVar11;
      iVar11 = iVar11 + -1;
      pdVar4 = pdVar4 + -1;
      iVar13 = iVar13 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar12 != uVar14);
    if (0 < n) {
      lVar7 = 0;
      do {
        wa1[lVar7] = 0.0;
        wa2[lVar7] = diag[lVar7] * x[lVar7];
        lVar7 = lVar7 + 1;
      } while ((ulong)uVar14 - 1 != lVar7);
    }
  }
  dVar17 = enorm(n,wa2);
  if (dVar17 <= delta) {
    return;
  }
  if (n < 1) {
    local_98 = enorm(n,wa1);
    if ((local_98 == 0.0) && (!NAN(local_98))) {
      return;
    }
  }
  else {
    uVar16 = (ulong)uVar14;
    uVar12 = 1;
    lVar7 = 0;
    lVar6 = 1;
    do {
      dVar22 = qtb[uVar12 - 1];
      lVar6 = (long)(int)lVar6;
      lVar8 = lVar7;
      do {
        wa1[lVar8] = r[lVar6 + -1] * dVar22 + wa1[lVar8];
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 1;
      } while (uVar16 - 1 != lVar8);
      wa1[uVar12 - 1] = wa1[uVar12 - 1] / diag[uVar12 - 1];
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 1;
    } while (uVar12 != uVar16);
    local_98 = enorm(n,wa1);
    dVar23 = delta / dVar17;
    dVar22 = 0.0;
    if ((local_98 == 0.0) && (!NAN(local_98))) goto LAB_00103475;
    if (0 < n) {
      lVar7 = 0;
      do {
        wa1[lVar7] = (wa1[lVar7] / local_98) / diag[lVar7];
        lVar7 = lVar7 + 1;
      } while (uVar16 - 1 != lVar7);
      if (0 < n) {
        uVar2 = 1;
        lVar7 = 1;
        pdVar4 = wa1;
        uVar12 = uVar16;
        do {
          uVar12 = uVar12 - 1;
          dVar22 = 0.0;
          uVar10 = 0;
          do {
            dVar22 = dVar22 + r[(long)(int)lVar7 + (uVar10 - 1)] * pdVar4[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
          wa2[uVar2 - 1] = dVar22;
          uVar2 = uVar2 + 1;
          pdVar4 = pdVar4 + 1;
          lVar7 = (long)(int)lVar7 + uVar10;
        } while (uVar2 != uVar16);
      }
    }
  }
  local_48 = delta / dVar17;
  dVar22 = enorm(n,wa2);
  dVar22 = (local_98 / dVar22) / dVar22;
  if (delta <= dVar22) {
    dVar23 = 0.0;
  }
  else {
    dVar23 = enorm(n,qtb);
    auVar19._8_8_ = dVar23;
    auVar19._0_8_ = dVar22;
    auVar20._8_8_ = local_98;
    auVar20._0_8_ = delta;
    auVar20 = divpd(auVar19,auVar20);
    dVar18 = auVar20._0_8_;
    dVar17 = auVar20._8_8_ * (dVar23 / dVar17) * dVar18;
    dVar23 = dVar17 - local_48;
    dVar21 = 1.0 - dVar18 * dVar18;
    dVar23 = dVar23 * dVar23 + dVar21 * (1.0 - local_48 * local_48);
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      dVar23 = SQRT(dVar23);
    }
    dVar23 = (local_48 * dVar21) / (dVar23 + -local_48 * dVar18 * dVar18 + dVar17);
  }
LAB_00103475:
  if (0 < n) {
    lVar7 = 0;
    do {
      x[lVar7] = wa1[lVar7] *
                 (double)(~-(ulong)(dVar22 <= delta) & (ulong)delta |
                         (ulong)dVar22 & -(ulong)(dVar22 <= delta)) * (1.0 - dVar23) +
                 x[lVar7] * dVar23;
      lVar7 = lVar7 + 1;
    } while ((ulong)uVar14 - 1 != lVar7);
  }
  return;
}

Assistant:

__cminpack_attr__
void __cminpack_func__(dogleg)(int n, const real *r, int lr, 
	const real *diag, const real *qtb, real delta, real *x, 
	real *wa1, real *wa2)
{
    /* System generated locals */
    real d1, d2, d3, d4;

    /* Local variables */
    int i, j, k, l, jj, jp1;
    real sum, temp, alpha, bnorm;
    real gnorm, qnorm, epsmch;
    real sgnorm;

/*     ********** */

/*     subroutine dogleg */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, the */
/*     problem is to determine the convex combination x of the */
/*     gauss-newton and scaled gradient directions that minimizes */
/*     (a*x - b) in the least squares sense, subject to the */
/*     restriction that the euclidean norm of d*x be at most delta. */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization of a. that is, if a = q*r, where q has */
/*     orthogonal columns and r is an upper triangular matrix, */
/*     then dogleg expects the full upper triangle of r and */
/*     the first n components of (q transpose)*b. */

/*     the subroutine statement is */

/*       subroutine dogleg(n,r,lr,diag,qtb,delta,x,wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an input array of length lr which must contain the upper */
/*         triangular matrix r stored by rows. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       x is an output array of length n which contains the desired */
/*         convex combination of the gauss-newton direction and the */
/*         scaled gradient direction. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --x;
    --qtb;
    --diag;
    --r;
    (void)lr;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

/*     first, calculate the gauss-newton direction. */

    jj = n * (n + 1) / 2 + 1;
    for (k = 1; k <= n; ++k) {
	j = n - k + 1;
	jp1 = j + 1;
	jj -= k;
	l = jj + 1;
	sum = 0.;
	if (n >= jp1) {
            for (i = jp1; i <= n; ++i) {
                sum += r[l] * x[i];
                ++l;
            }
        }
	temp = r[jj];
	if (temp == 0.) {
            l = j;
            for (i = 1; i <= j; ++i) {
                /* Computing MAX */
                d2 = fabs(r[l]);
                temp = max(temp,d2);
                l = l + n - i;
            }
            temp = epsmch * temp;
            if (temp == 0.) {
                temp = epsmch;
            }
        }
	x[j] = (qtb[j] - sum) / temp;
    }

/*     test whether the gauss-newton direction is acceptable. */

    for (j = 1; j <= n; ++j) {
	wa1[j] = 0.;
	wa2[j] = diag[j] * x[j];
    }
    qnorm = __cminpack_func__(enorm)(n, &wa2[1]);
    if (qnorm <= delta) {
        return;
    }

/*     the gauss-newton direction is not acceptable. */
/*     next, calculate the scaled gradient direction. */

    l = 1;
    for (j = 1; j <= n; ++j) {
	temp = qtb[j];
	for (i = j; i <= n; ++i) {
	    wa1[i] += r[l] * temp;
	    ++l;
	}
	wa1[j] /= diag[j];
    }

/*     calculate the norm of the scaled gradient and test for */
/*     the special case in which the scaled gradient is zero. */

    gnorm = __cminpack_func__(enorm)(n, &wa1[1]);
    sgnorm = 0.;
    alpha = delta / qnorm;
    if (gnorm != 0.) {

/*     calculate the point along the scaled gradient */
/*     at which the quadratic is minimized. */

        for (j = 1; j <= n; ++j) {
            wa1[j] = wa1[j] / gnorm / diag[j];
        }
        l = 1;
        for (j = 1; j <= n; ++j) {
            sum = 0.;
            for (i = j; i <= n; ++i) {
                sum += r[l] * wa1[i];
                ++l;
            }
            wa2[j] = sum;
        }
        temp = __cminpack_func__(enorm)(n, &wa2[1]);
        sgnorm = gnorm / temp / temp;

/*     test whether the scaled gradient direction is acceptable. */

        alpha = 0.;
        if (sgnorm < delta) {

/*     the scaled gradient direction is not acceptable. */
/*     finally, calculate the point along the dogleg */
/*     at which the quadratic is minimized. */

            bnorm = __cminpack_func__(enorm)(n, &qtb[1]);
            temp = bnorm / gnorm * (bnorm / qnorm) * (sgnorm / delta);
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            /* Computing 2nd power */
            d2 = temp - delta / qnorm;
            /* Computing 2nd power */
            d3 = delta / qnorm;
            /* Computing 2nd power */
            d4 = sgnorm / delta;
            temp = temp - delta / qnorm * (d1 * d1)
                   + sqrt(d2 * d2
                          + (1 - d3 * d3) * (1 - d4 * d4));
            /* Computing 2nd power */
            d1 = sgnorm / delta;
            alpha = delta / qnorm * (1 - d1 * d1) / temp;
        }
    }

/*     form appropriate convex combination of the gauss-newton */
/*     direction and the scaled gradient direction. */

    temp = (1 - alpha) * min(sgnorm,delta);
    for (j = 1; j <= n; ++j) {
	x[j] = temp * wa1[j] + alpha * x[j];
    }

/*     last card of subroutine dogleg. */

}